

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture2ReadTestBase<unsigned_char,_4U,_32856U>::runTest
          (ktxTexture2ReadTestBase<unsigned_char,_4U,_32856U> *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  int *piVar6;
  long lVar7;
  ktx_size_t levelOffset;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture2 *texture2;
  AssertHelper local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ktx_error_code_e local_54;
  AssertHelper local_50;
  ktxTexture2 *local_48;
  ktxTexture2ReadTestBase<unsigned_char,_4U,_32856U> *local_40;
  ktx_uint64_t local_38;
  
  local_48 = (ktxTexture2 *)0x0;
  local_40 = this;
  local_54 = ktxTexture2_CreateFromMemory(this->ktx2MemFile,this->ktx2MemFileLen,1);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_88._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_78,"result","KTX_SUCCESS",&local_54,(ktx_error_code_e *)&local_88);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x89b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl._0_1_ = local_48 != (ktxTexture2 *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48 == (ktxTexture2 *)0x0) {
    testing::Message::Message((Message *)&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_90.data_)->line,"ktxTexture2_Create failed: ",0x1b);
    pcVar5 = (char *)ktxErrorString(local_54);
    piVar6 = &(local_90.data_)->line;
    if (pcVar5 == (char *)0x0) {
      sVar3 = 6;
      pcVar5 = "(null)";
    }
    else {
      sVar3 = strlen(pcVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,pcVar5,sVar3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_88,(AssertionResult *)"texture2 != __null",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x89c,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
  }
  else {
    local_88._M_head_impl._4_4_ = SUB84(_Var1._M_head_impl,4);
    local_88._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<class_id,class_id>
              ((internal *)local_78,"texture2->classId","ktxTexture2_c",&local_48->classId,
               (class_id *)&local_88);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x89f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    bVar2 = WriterTestHelper<unsigned_char,_4U,_32856U>::texinfo::compare
                      (&(local_40->super_ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U>).helper
                        .super_WriterTestHelper<unsigned_char,_4U,_32856U>.texinfo,local_48);
    local_88._M_head_impl._0_1_ = bVar2;
    local_90.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_78,"helper.texinfo.compare(texture2)","true",(bool *)&local_88,
               (bool *)&local_90);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x8a0,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<ktxKVListEntry*,ktxKVListEntry*>
              ((internal *)local_78,"texture2->kvDataHead","(ktxKVListEntry*)0",
               &local_48->kvDataHead,(ktxKVListEntry **)&local_88);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x8a1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    if (local_48->numLevels != 0) {
      local_38 = local_40->levelIndex
                 [(local_40->super_ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U>).helper.
                  super_WriterTestHelper<unsigned_char,_4U,_32856U>.numLevels - 1].byteOffset;
      lVar7 = 0;
      uVar4 = 0;
      do {
        local_54 = ktxTexture2_GetImageOffset(local_48,uVar4 & 0xffffffff,0,0,&local_88);
        local_90.data_ = local_90.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                  ((internal *)local_78,"result","KTX_SUCCESS",&local_54,
                   (ktx_error_code_e *)&local_90);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_90);
          pcVar5 = "";
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x8a9,pcVar5);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_90.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_90.data_ + 8))();
          }
        }
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70,local_70);
        }
        local_90.data_ =
             (AssertHelperData *)
             (*(long *)((long)&local_40->levelIndex->byteOffset + lVar7) - local_38);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_78,"levelOffset","levelIndex[level].byteOffset - baseOffset",
                   (unsigned_long *)&local_88,(unsigned_long *)&local_90);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_90);
          pcVar5 = "";
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x8aa,pcVar5);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_90.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_90.data_ + 8))();
          }
        }
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70,local_70);
        }
        uVar4 = uVar4 + 1;
        lVar7 = lVar7 + 0x18;
      } while (uVar4 < local_48->numLevels);
    }
    ktxTexture2_destruct();
  }
  return;
}

Assistant:

void runTest() {
        ktxTexture2* texture2 = 0;
        KTX_error_code result;

        result = ktxTexture2_CreateFromMemory(ktx2MemFile, ktx2MemFileLen,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture2);

        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture2 != NULL) << "ktxTexture2_Create failed: "
                                      << ktxErrorString(result);

        EXPECT_EQ(texture2->classId, ktxTexture2_c);
        EXPECT_EQ(helper.texinfo.compare(texture2), true);
        EXPECT_NE(texture2->kvDataHead, (ktxKVListEntry*)0);

        // Check the levelOffsets are as expected.
        ktx_size_t baseOffset = levelIndex[helper.numLevels - 1].byteOffset;
        for (ktx_uint32_t level = 0; level < texture2->numLevels; level++) {
            ktx_size_t levelOffset;
            result = ktxTexture2_GetImageOffset(texture2, level, 0, 0,
                                                &levelOffset);
            EXPECT_EQ(result, KTX_SUCCESS);
            EXPECT_EQ(levelOffset, levelIndex[level].byteOffset - baseOffset);
        }

        ktxTexture2_destruct(texture2);

    }